

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O0

int jpc_dec_cp_setfrompoc(jpc_dec_cp_t *cp,jpc_poc_t *poc,int reset)

{
  int iVar1;
  jpc_pchg_t *pjVar2;
  jpc_pchg_t *pchg;
  int pchgno;
  int reset_local;
  jpc_poc_t *poc_local;
  jpc_dec_cp_t *cp_local;
  
  if (reset != 0) {
    while (iVar1 = jpc_pchglist_numpchgs(cp->pchglist), 0 < iVar1) {
      pjVar2 = jpc_pchglist_remove(cp->pchglist,0);
      jpc_pchg_destroy(pjVar2);
    }
  }
  pchg._0_4_ = 0;
  while( true ) {
    if (poc->numpchgs <= (int)pchg) {
      return 0;
    }
    pjVar2 = jpc_pchg_copy(poc->pchgs + (int)pchg);
    if (pjVar2 == (jpc_pchg_t *)0x0) break;
    iVar1 = jpc_pchglist_insert(cp->pchglist,-1,pjVar2);
    if (iVar1 != 0) {
      return -1;
    }
    pchg._0_4_ = (int)pchg + 1;
  }
  return -1;
}

Assistant:

static int jpc_dec_cp_setfrompoc(jpc_dec_cp_t *cp, jpc_poc_t *poc, int reset)
{
	int pchgno;
	jpc_pchg_t *pchg;
	if (reset) {
		while (jpc_pchglist_numpchgs(cp->pchglist) > 0) {
			pchg = jpc_pchglist_remove(cp->pchglist, 0);
			jpc_pchg_destroy(pchg);
		}
	}
	for (pchgno = 0; pchgno < poc->numpchgs; ++pchgno) {
		if (!(pchg = jpc_pchg_copy(&poc->pchgs[pchgno]))) {
			return -1;
		}
		if (jpc_pchglist_insert(cp->pchglist, -1, pchg)) {
			return -1;
		}
	}
	return 0;
}